

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZMatrix<std::complex<float>_>_> * __thiscall
TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator=
          (TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *this,
          TPZMatrix<std::complex<float>_> *rval)

{
  bool bVar1;
  TPZMatrix<std::complex<float>_> *pTVar2;
  TPZMatrix<std::complex<float>_> *in_RSI;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *in_stack_ffffffffffffffd0;
  TPZReference *this_00;
  
  this_00 = in_RDI;
  if ((in_RDI->fPointer != (TPZMatrix<std::complex<float>_> *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_RDI), bVar1)) {
    Release(in_stack_ffffffffffffffd0);
  }
  pTVar2 = (TPZMatrix<std::complex<float>_> *)operator_new(0x10);
  TPZReference::TPZReference(this_00,in_RSI);
  in_RDI->fPointer = pTVar2;
  return (TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_RDI;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }